

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t *ts;
  int iVar1;
  size_type sVar2;
  CompilerError *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint32_t *ts_00;
  char *pcVar4;
  uint uVar5;
  allocator local_41;
  string local_40;
  uint32_t id_local;
  uint *ts_3;
  
  iVar1 = *(int *)&(type->super_IVariant).field_0xc;
  id_local = id;
  if (iVar1 - 0x10U < 2) {
    image_type_hlsl_abi_cxx11_(__return_storage_ptr__,this,type,id);
    return __return_storage_ptr__;
  }
  if (iVar1 == 1) {
    pcVar4 = "void";
    goto LAB_00257683;
  }
  if (iVar1 == 0x12) {
    sVar2 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.comparison_ids._M_h,&id_local);
    pcVar4 = "SamplerComparisonState";
    if (sVar2 == 0) {
      pcVar4 = "SamplerState";
    }
    goto LAB_00257683;
  }
  if (iVar1 == 0xf) {
    if ((this->super_CompilerGLSL).backend.explicit_struct_type == true) {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_40,this,(ulong)(type->super_IVariant).self.id);
      join<char_const(&)[8],std::__cxx11::string>
                (__return_storage_ptr__,(spirv_cross *)"struct ",(char (*) [8])&local_40,ts_1);
      ::std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (__return_storage_ptr__,this,(ulong)(type->super_IVariant).self.id,1);
    return __return_storage_ptr__;
  }
  uVar5 = type->columns ^ 1 | type->vecsize ^ 1;
  ts_3 = (uint *)(ulong)uVar5;
  if (uVar5 == 0) {
    switch(iVar1) {
    case 2:
      pcVar4 = "bool";
      break;
    default:
      goto switchD_002576cf_caseD_3;
    case 5:
      if (this->field_0x2425 == '\x01') {
        pcVar4 = "int16_t";
      }
      else {
        pcVar4 = "min16int";
      }
      break;
    case 6:
      if (this->field_0x2425 == '\x01') {
        pcVar4 = "uint16_t";
      }
      else {
        pcVar4 = "min16uint";
      }
      break;
    case 7:
      pcVar4 = (this->super_CompilerGLSL).backend.basic_int_type;
      break;
    case 8:
      pcVar4 = (this->super_CompilerGLSL).backend.basic_uint_type;
      break;
    case 9:
      if (*(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x3c) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_40,"64-bit integers only supported in SM 6.0.",&local_41);
        CompilerError::CompilerError(pCVar3,&local_40);
        __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      pcVar4 = "int64_t";
      break;
    case 10:
      if (*(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x3c) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_40,"64-bit integers only supported in SM 6.0.",&local_41);
        CompilerError::CompilerError(pCVar3,&local_40);
        __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      pcVar4 = "uint64_t";
      break;
    case 0xb:
      pcVar4 = "atomic_uint";
      break;
    case 0xc:
      if (this->field_0x2425 == '\x01') {
        pcVar4 = "half";
      }
      else {
        pcVar4 = "min16float";
      }
      break;
    case 0xd:
      pcVar4 = "float";
      break;
    case 0xe:
      pcVar4 = "double";
    }
    goto LAB_00257683;
  }
  ts = &type->vecsize;
  uVar5 = iVar1 - 2;
  if (type->vecsize < 2 || type->columns != 1) {
    if (0xc < uVar5) {
switchD_002576cf_caseD_3:
      pcVar4 = "???";
LAB_00257683:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_40)
      ;
      return __return_storage_ptr__;
    }
    ts_00 = &type->columns;
    switch(uVar5) {
    case 0:
      pcVar4 = "bool";
      goto LAB_002578bf;
    default:
      goto switchD_002576cf_caseD_3;
    case 3:
      pcVar4 = "int16_t";
      local_40._M_dataplus._M_p = "min16int";
      break;
    case 4:
      pcVar4 = "uint16_t";
      local_40._M_dataplus._M_p = "min16uint";
      break;
    case 5:
      join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x30c617,(char (*) [4])ts_00,(uint *)0x309ed5
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 6:
      pcVar4 = "uint";
LAB_002578bf:
      join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar4,(char (*) [5])ts_00,(uint *)0x309ed5,
                 (char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 10:
      pcVar4 = "half";
      local_40._M_dataplus._M_p = "min16float";
      break;
    case 0xb:
      join<char_const(&)[6],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x30fd14,(char (*) [6])ts_00,(uint *)0x309ed5
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 0xc:
      join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x30ee30,(char (*) [7])ts_00,(uint *)0x309ed5
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    }
    if (this->field_0x2425 != '\0') {
      local_40._M_dataplus._M_p = pcVar4;
    }
    join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)&local_40,(char **)ts_00,(uint *)0x309ed5,
               (char (*) [2])ts,ts_3);
    return __return_storage_ptr__;
  }
  switch(uVar5) {
  case 0:
    pcVar4 = "bool";
    goto LAB_00257954;
  default:
    goto switchD_002576cf_caseD_3;
  case 3:
    pcVar4 = "int16_t";
    local_40._M_dataplus._M_p = "min16int";
    break;
  case 4:
    pcVar4 = "uint16_t";
    local_40._M_dataplus._M_p = "min16uint";
    break;
  case 5:
    join<char_const(&)[4],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)0x30c617,(char (*) [4])ts,
               &switchD_0025771a::switchdataD_0030ba90);
    return __return_storage_ptr__;
  case 6:
    pcVar4 = "uint";
LAB_00257954:
    join<char_const(&)[5],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar4,(char (*) [5])ts,
               &switchD_0025771a::switchdataD_0030ba90);
    return __return_storage_ptr__;
  case 7:
    pcVar4 = "i64vec";
    goto LAB_0025796b;
  case 8:
    pcVar4 = "u64vec";
    goto LAB_0025796b;
  case 10:
    pcVar4 = "half";
    local_40._M_dataplus._M_p = "min16float";
    break;
  case 0xb:
    join<char_const(&)[6],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)0x30fd14,(char (*) [6])ts,
               &switchD_0025771a::switchdataD_0030ba90);
    return __return_storage_ptr__;
  case 0xc:
    pcVar4 = "double";
LAB_0025796b:
    join<char_const(&)[7],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar4,(char (*) [7])ts,
               &switchD_0025771a::switchdataD_0030ba90);
    return __return_storage_ptr__;
  }
  if (this->field_0x2425 != '\0') {
    local_40._M_dataplus._M_p = pcVar4;
  }
  join<char_const*,unsigned_int_const&>
            (__return_storage_ptr__,(spirv_cross *)&local_40,(char **)ts,
             (uint *)local_40._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	// Ignore the pointer type since GLSL doesn't have pointers.

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_hlsl(type, id);

	case SPIRType::Sampler:
		return comparison_ids.count(id) ? "SamplerComparisonState" : "SamplerState";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			if (hlsl_options.enable_16bit_types)
				return "half";
			else
				return "min16float";
		case SPIRType::Short:
			if (hlsl_options.enable_16bit_types)
				return "int16_t";
			else
				return "min16int";
		case SPIRType::UShort:
			if (hlsl_options.enable_16bit_types)
				return "uint16_t";
			else
				return "min16uint";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "int64_t";
		case SPIRType::UInt64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "uint64_t";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.vecsize);
		case SPIRType::Int:
			return join("int", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.vecsize);
		case SPIRType::Float:
			return join("float", type.vecsize);
		case SPIRType::Double:
			return join("double", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("int", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.columns, "x", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.columns, "x", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("float", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("double", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}